

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O0

void Cmd_soundlinks(FCommandLine *argv,APlayerPawn *who,int key)

{
  uint uVar1;
  sfxinfo_t *psVar2;
  char *pcVar3;
  char *pcVar4;
  sfxinfo_t *sfx;
  uint i;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  sfx._0_4_ = 0;
  while( true ) {
    uVar1 = TArray<sfxinfo_t,_sfxinfo_t>::Size(&S_sfx);
    if (uVar1 <= (uint)sfx) break;
    psVar2 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)(uint)sfx);
    if (((psVar2->link != 0xffffffff) && ((*(ushort *)&psVar2->field_0x30 & 1) == 0)) &&
       ((*(ushort *)&psVar2->field_0x30 >> 1 & 1) == 0)) {
      pcVar3 = FString::GetChars(&psVar2->name);
      psVar2 = TArray<sfxinfo_t,_sfxinfo_t>::operator[](&S_sfx,(ulong)psVar2->link);
      pcVar4 = FString::GetChars(&psVar2->name);
      Printf("%s -> %s\n",pcVar3,pcVar4);
    }
    sfx._0_4_ = (uint)sfx + 1;
  }
  return;
}

Assistant:

CCMD (soundlinks)
{
	unsigned int i;

	for (i = 0; i < S_sfx.Size (); i++)
	{
		const sfxinfo_t *sfx = &S_sfx[i];

		if (sfx->link != sfxinfo_t::NO_LINK &&
			!sfx->bRandomHeader &&
			!sfx->bPlayerReserve)
		{
			Printf ("%s -> %s\n", sfx->name.GetChars(), S_sfx[sfx->link].name.GetChars());
		}
	}
}